

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reading.c
# Opt level: O2

int read_all_frequencies(FILE *fp,frequency_t **records)

{
  frequency_t **ppfVar1;
  int iVar2;
  uint fields_number;
  int iVar3;
  frequency_t *pfVar4;
  long lVar5;
  size_t sz;
  size_t __size;
  char **field_names;
  frequency_t **local_40;
  char **record_values;
  
  record_values = (char **)0x0;
  local_40 = records;
  iVar2 = count_lines(fp);
  field_names = (char **)0x0;
  fields_number = read_header(fp,&field_names);
  if ((int)fields_number < 0) {
    sz = (size_t)(int)fields_number;
  }
  else {
    if (iVar2 < 2) {
      free_cstr_arr(field_names,(ulong)fields_number);
      return -(uint)(iVar2 != 1);
    }
    __size = (ulong)(iVar2 - 1) * 0x5c;
    pfVar4 = (frequency_t *)malloc(__size);
    *local_40 = pfVar4;
    if (pfVar4 != (frequency_t *)0x0) {
      iVar2 = 0;
      for (lVar5 = 0; ppfVar1 = local_40, __size - lVar5 != 0; lVar5 = lVar5 + 0x5c) {
        iVar3 = read_record(fp,fields_number,&record_values);
        if (0 < iVar3) {
          read_frequency((frequency_t *)((*local_40)->trip_id + lVar5),fields_number,field_names,
                         record_values);
          iVar2 = iVar2 + 1;
        }
        free_cstr_arr(record_values,(ulong)fields_number);
      }
      if (iVar2 == 0) {
        pfVar4 = (frequency_t *)realloc(*local_40,0);
        *ppfVar1 = pfVar4;
      }
      free_cstr_arr(field_names,(ulong)fields_number);
      return iVar2;
    }
    sz = (size_t)fields_number;
  }
  free_cstr_arr(field_names,sz);
  return -1;
}

Assistant:

int read_all_frequencies(FILE *fp, frequency_t **records) {
    char **record_values = NULL;
    int lines_count = count_lines(fp) - 1;
    int record_count = 0;

    char **field_names = NULL;
    int field_count = read_header(fp, &field_names);

    if (field_count < 0) {
        free_cstr_arr(field_names, field_count);
        return -1;
    }

    if (lines_count < 1) {
        free_cstr_arr(field_names, field_count);
        free(record_values);
        return (lines_count < 0) ? -1 : 0;
    }

    *records = malloc(lines_count * sizeof(**records));
    if (*records == NULL) {
        free_cstr_arr(field_names, field_count);
        free(record_values);
        return -1;
    }

    for (int i = 0; i < lines_count; i++) {
        if (read_record(fp, field_count, &record_values) > 0) {
            read_frequency(&(*records)[i], field_count, (const char **)field_names, (const char **)record_values);
            // free_cstr_arr(record_values, field_count);
            record_count++;
        }
        free_cstr_arr(record_values, field_count);
    }

    if (record_count == 0)
        *records = realloc(*records, record_count * sizeof(**records));

    free_cstr_arr(field_names, field_count);
    return record_count;
}